

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O0

void dlib::cpu::compute_adam_update
               (size_t begin,size_t end,tensor *s,tensor *m,tensor *v,float t,float learning_rate,
               float weight_decay,float momentum1,float momentum2,tensor *params,tensor *params_grad
               )

{
  undefined1 auVar1 [16];
  ulong uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  ostream *poVar8;
  undefined8 uVar9;
  ostream *poVar10;
  string *a;
  undefined4 extraout_var;
  long lVar12;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  tensor *in_RCX;
  tensor *in_RDX;
  ulong in_RSI;
  ulong in_RDI;
  tensor *in_R8;
  tensor *in_R9;
  uint in_XMM0_Da;
  float fVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  float in_XMM1_Da;
  uint in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  tensor *in_stack_00000008;
  float g;
  size_t i;
  float *ppgrad;
  float *pparams;
  float *ps;
  float *pv;
  float *pm;
  float alpha;
  float eps;
  ostringstream dlib_o_out_1;
  ostringstream dlib_o_out;
  string *in_stack_fffffffffffffb40;
  undefined8 in_stack_fffffffffffffb48;
  error_type eVar17;
  fatal_error *in_stack_fffffffffffffb50;
  ulong local_3d0;
  ostringstream local_370 [383];
  undefined1 local_1f1;
  ostringstream local_1c0 [376];
  tensor *local_48;
  float local_3c;
  float local_38;
  uint local_34;
  float local_30;
  uint local_2c;
  tensor *local_28;
  tensor *local_20;
  tensor *local_18;
  ulong local_10;
  ulong local_8;
  long lVar11;
  undefined4 extraout_var_00;
  
  eVar17 = (error_type)((ulong)in_stack_fffffffffffffb48 >> 0x20);
  local_48 = in_R9;
  local_3c = in_XMM4_Da;
  local_38 = in_XMM3_Da;
  local_34 = in_XMM2_Da;
  local_30 = in_XMM1_Da;
  local_2c = in_XMM0_Da;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  sVar6 = tensor::size(in_RDX);
  sVar7 = tensor::size(local_20);
  if (sVar6 == sVar7) {
    sVar6 = tensor::size(local_18);
    sVar7 = tensor::size(local_28);
    if (sVar6 == sVar7) {
      sVar6 = tensor::size(local_18);
      sVar7 = tensor::size(local_48);
      if (sVar6 == sVar7) {
        sVar6 = tensor::size(local_18);
        sVar7 = tensor::size(in_stack_00000008);
        uVar2 = local_10;
        if (sVar6 == sVar7) {
          if (local_8 <= local_10) {
            sVar6 = tensor::size(local_48);
            if (uVar2 <= sVar6) {
              dVar14 = std::pow((double)(ulong)(uint)local_3c,(double)(ulong)local_2c);
              dVar14 = std::sqrt((double)(ulong)(uint)(1.0 - SUB84(dVar14,0)));
              dVar15 = std::pow((double)(ulong)(uint)local_38,(double)(ulong)local_2c);
              iVar3 = (*local_20->_vptr_tensor[3])();
              lVar11 = CONCAT44(extraout_var,iVar3);
              iVar3 = (*local_28->_vptr_tensor[3])();
              lVar12 = CONCAT44(extraout_var_00,iVar3);
              iVar3 = (*local_18->_vptr_tensor[4])();
              iVar4 = (*local_48->_vptr_tensor[2])();
              iVar5 = (*in_stack_00000008->_vptr_tensor[2])();
              for (local_3d0 = local_8; local_3d0 < local_10; local_3d0 = local_3d0 + 1) {
                auVar1 = vfmadd213ss_fma(ZEXT416(*(uint *)(CONCAT44(extraout_var_02,iVar4) +
                                                          local_3d0 * 4)),ZEXT416(local_34),
                                         ZEXT416(*(uint *)(CONCAT44(extraout_var_03,iVar5) +
                                                          local_3d0 * 4)));
                fVar13 = auVar1._0_4_;
                auVar1 = vfmadd213ss_fma(ZEXT416(*(uint *)(lVar11 + local_3d0 * 4)),
                                         ZEXT416((uint)local_38),
                                         ZEXT416((uint)((1.0 - local_38) * fVar13)));
                *(int *)(lVar11 + local_3d0 * 4) = auVar1._0_4_;
                auVar1 = vfmadd213ss_fma(ZEXT416(*(uint *)(lVar12 + local_3d0 * 4)),
                                         ZEXT416((uint)local_3c),
                                         ZEXT416((uint)((1.0 - local_3c) * fVar13 * fVar13)));
                *(int *)(lVar12 + local_3d0 * 4) = auVar1._0_4_;
                fVar13 = *(float *)(lVar11 + local_3d0 * 4);
                dVar16 = std::sqrt((double)(ulong)*(uint *)(lVar12 + local_3d0 * 4));
                *(float *)(CONCAT44(extraout_var_01,iVar3) + local_3d0 * 4) =
                     (-((local_30 * SUB84(dVar14,0)) / (1.0 - SUB84(dVar15,0))) * fVar13) /
                     (SUB84(dVar16,0) + 1e-08);
              }
              return;
            }
          }
          dlib_assert_breakpoint();
          std::__cxx11::ostringstream::ostringstream(local_370);
          poVar8 = std::operator<<((ostream *)local_370,"\n\nError detected at line ");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x2b5);
          std::operator<<(poVar8,".\n");
          poVar8 = std::operator<<((ostream *)local_370,"Error detected in file ");
          poVar8 = std::operator<<(poVar8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                                  );
          std::operator<<(poVar8,".\n");
          poVar8 = std::operator<<((ostream *)local_370,"Error detected in function ");
          poVar8 = std::operator<<(poVar8,
                                   "void dlib::cpu::compute_adam_update(size_t, size_t, tensor &, tensor &, tensor &, const float, const float, const float, const float, const float, const tensor &, const tensor &)"
                                  );
          std::operator<<(poVar8,".\n\n");
          poVar8 = std::operator<<((ostream *)local_370,"Failing expression was ");
          poVar8 = std::operator<<(poVar8,"begin <= end && end <= params.size()");
          std::operator<<(poVar8,".\n");
          poVar8 = (ostream *)std::ostream::operator<<(local_370,std::boolalpha);
          poVar10 = std::operator<<(poVar8,"");
          std::operator<<(poVar10,"\n");
          eVar17 = (error_type)((ulong)poVar10 >> 0x20);
          a = (string *)__cxa_allocate_exception(0x30);
          std::__cxx11::ostringstream::str();
          fatal_error::fatal_error((fatal_error *)poVar8,eVar17,a);
          __cxa_throw(a,&fatal_error::typeinfo,fatal_error::~fatal_error);
        }
      }
    }
  }
  dlib_assert_breakpoint();
  std::__cxx11::ostringstream::ostringstream(local_1c0);
  poVar8 = std::operator<<((ostream *)local_1c0,"\n\nError detected at line ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x2b4);
  std::operator<<(poVar8,".\n");
  poVar8 = std::operator<<((ostream *)local_1c0,"Error detected in file ");
  poVar8 = std::operator<<(poVar8,
                           "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/cpu_dlib.cpp"
                          );
  std::operator<<(poVar8,".\n");
  poVar8 = std::operator<<((ostream *)local_1c0,"Error detected in function ");
  poVar8 = std::operator<<(poVar8,
                           "void dlib::cpu::compute_adam_update(size_t, size_t, tensor &, tensor &, tensor &, const float, const float, const float, const float, const float, const tensor &, const tensor &)"
                          );
  std::operator<<(poVar8,".\n\n");
  poVar8 = std::operator<<((ostream *)local_1c0,"Failing expression was ");
  poVar8 = std::operator<<(poVar8,
                           "s.size() == m.size() && s.size() == v.size() && s.size() == params.size() && s.size() == params_grad.size()"
                          );
  std::operator<<(poVar8,".\n");
  poVar8 = (ostream *)std::ostream::operator<<(local_1c0,std::boolalpha);
  poVar8 = std::operator<<(poVar8,"");
  std::operator<<(poVar8,"\n");
  local_1f1 = 1;
  uVar9 = __cxa_allocate_exception(0x30);
  std::__cxx11::ostringstream::str();
  fatal_error::fatal_error(in_stack_fffffffffffffb50,eVar17,in_stack_fffffffffffffb40);
  local_1f1 = 0;
  __cxa_throw(uVar9,&fatal_error::typeinfo,fatal_error::~fatal_error);
}

Assistant:

void compute_adam_update (
            size_t begin,
            size_t end,
            tensor& s,
            tensor& m,
            tensor& v,
            const float t,
            const float learning_rate,
            const float weight_decay,
            const float momentum1,
            const float momentum2,
            const tensor& params,
            const tensor& params_grad
        )
        {
            DLIB_CASSERT(s.size() == m.size() &&
                         s.size() == v.size() &&
                         s.size() == params.size() &&
                         s.size() == params_grad.size());
            DLIB_CASSERT(begin <= end && end <= params.size());
            const float eps = 1e-8;
            const float alpha = learning_rate*std::sqrt(1-std::pow(momentum2,t))/(1-std::pow(momentum1, t));

            // The loop is equivalent to doing this:
            //   m = momentum1*m + (1-momentum1)    *   (weight_decay*params + params_grad);
            //   v = momentum2*v + (1-momentum2)*squared(weight_decay*params + params_grad);
            //   s = -alpha*m/(sqrt(v) + eps);
            auto pm = m.host();
            auto pv = v.host();
            auto ps = s.host_write_only();
            auto pparams = params.host();
            auto ppgrad = params_grad.host();
            for (size_t i = begin; i < end; ++i)
            {
                float g = weight_decay*pparams[i] + ppgrad[i];
                pm[i] = momentum1*pm[i] + (1-momentum1)*g;
                pv[i] = momentum2*pv[i] + (1-momentum2)*g*g;
                ps[i] = -alpha*pm[i]/(std::sqrt(pv[i]) + eps);
            }
        }